

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

void ecx_esidump(ecx_contextt *context,uint16 slave,uint8 *esibuf)

{
  uint8 uVar1;
  uint16 configadr;
  int iVar2;
  uint64 uVar3;
  ulong uVar4;
  long lVar5;
  undefined6 in_register_00000032;
  
  uVar4 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar1 = context->slavelist[uVar4].eep_pdi;
  ecx_eeprom2master(context,slave);
  iVar2 = (uint)(context->slavelist[uVar4].eep_8byte != '\0') * 2;
  lVar5 = 0;
  configadr = context->slavelist[uVar4].configadr;
  do {
    uVar3 = ecx_readeepromFP(context,configadr,(short)lVar5 + 0x40,20000);
    *(uint64 *)(esibuf + lVar5 * 2) = uVar3;
    if (0x800 < (uint)(iVar2 + 0x42 + (int)lVar5)) break;
    lVar5 = lVar5 + (ulong)(iVar2 + 2);
  } while ((int)uVar3 != -1);
  if (uVar1 != '\0') {
    ecx_eeprom2pdi(context,slave);
    return;
  }
  return;
}

Assistant:

void ecx_esidump(ecx_contextt *context, uint16 slave, uint8 *esibuf)
{
   int address, incr;
   uint16 configadr;
   uint64 *p64;
   uint16 *p16;
   uint64 edat;
   uint8 eectl = context->slavelist[slave].eep_pdi;

   ecx_eeprom2master(context, slave); /* set eeprom control to master */
   configadr = context->slavelist[slave].configadr;
   address = ECT_SII_START;
   p16=(uint16*)esibuf;
   if (context->slavelist[slave].eep_8byte)
   {
      incr = 4;
   }
   else
   {
      incr = 2;
   }
   do
   {
      edat = ecx_readeepromFP(context, configadr, address, EC_TIMEOUTEEP);
      p64 = (uint64*)p16;
      *p64 = edat;
      p16 += incr;
      address += incr;
   } while ((address <= (EC_MAXEEPBUF >> 1)) && ((uint32)edat != 0xffffffff));

   if (eectl)
   {
      ecx_eeprom2pdi(context, slave); /* if eeprom control was previously pdi then restore */
   }
}